

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestRootNodes::Run(GraphTestRootNodes *this)

{
  pointer *err_00;
  Test *pTVar1;
  undefined8 uVar2;
  bool condition;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference ppNVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [8];
  string name;
  size_t i;
  undefined1 local_58 [8];
  vector<Node_*,_std::allocator<Node_*>_> root_nodes;
  string err;
  int fail_count;
  GraphTestRootNodes *this_local;
  
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 0xc));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build out1: cat in1\nbuild mid1: cat in1\nbuild out2: cat mid1\nbuild out3 out4: cat mid1\n"
              ,stack0xffffffffffffffe4);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    err_00 = &root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)err_00);
    State::RootNodes((vector<Node_*,_std::allocator<Node_*>_> *)local_58,
                     &(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
                     (string *)err_00);
    pTVar1 = g_current_test;
    sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_58);
    testing::Test::Check
              (pTVar1,sVar5 == 4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0xd3,"4u == root_nodes.size()");
    name.field_2._8_8_ = 0;
    while( true ) {
      uVar2 = name.field_2._8_8_;
      sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                        ((vector<Node_*,_std::allocator<Node_*>_> *)local_58);
      if (sVar5 <= (ulong)uVar2) break;
      ppNVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_58,name.field_2._8_8_);
      psVar7 = Node::path_abi_cxx11_(*ppNVar6);
      std::__cxx11::string::string(local_90,(string *)psVar7);
      pTVar1 = g_current_test;
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
      condition = std::operator==("out",&local_b0);
      testing::Test::Check
                (pTVar1,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0xd6,"\"out\" == name.substr(0, 3)");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string(local_90);
      name.field_2._8_8_ = name.field_2._8_8_ + 1;
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_58);
    std::__cxx11::string::~string
              ((string *)
               &root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(GraphTest, RootNodes) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out1: cat in1\n"
"build mid1: cat in1\n"
"build out2: cat mid1\n"
"build out3 out4: cat mid1\n"));

  string err;
  vector<Node*> root_nodes = state_.RootNodes(&err);
  EXPECT_EQ(4u, root_nodes.size());
  for (size_t i = 0; i < root_nodes.size(); ++i) {
    string name = root_nodes[i]->path();
    EXPECT_EQ("out", name.substr(0, 3));
  }
}